

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void recordFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int n;
  sqlite3 *db_00;
  char *z;
  u8 *aRet;
  sqlite3 *db;
  u32 local_30;
  int nRet;
  u32 nVal;
  int nSerial;
  u32 iSerial;
  int file_format;
  sqlite3_value **argv_local;
  sqlite3_context *psStack_10;
  int argc_local;
  sqlite3_context *context_local;
  
  nSerial = 1;
  _iSerial = argv;
  argv_local._4_4_ = argc;
  psStack_10 = context;
  nVal = sqlite3VdbeSerialType(*argv,1,&local_30);
  nRet = sqlite3VarintLen((ulong)nVal);
  db_00 = sqlite3_context_db_handle(psStack_10);
  n = nRet + 1 + local_30;
  z = (char *)sqlite3DbMallocRawNN(db_00,(long)n);
  if (z == (char *)0x0) {
    sqlite3_result_error_nomem(psStack_10);
  }
  else {
    *z = (char)nRet + '\x01';
    if (nVal < 0x80) {
      z[1] = (char)nVal;
    }
    else {
      sqlite3PutVarint((uchar *)(z + 1),(ulong)nVal);
    }
    sqlite3VdbeSerialPut((u8 *)(z + (nRet + 1)),*_iSerial,nVal);
    sqlite3_result_blob(psStack_10,z,n,(_func_void_void_ptr *)0xffffffffffffffff);
    sqlite3DbFreeNN(db_00,z);
  }
  return;
}

Assistant:

static void recordFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const int file_format = 1;
  u32 iSerial;                    /* Serial type */
  int nSerial;                    /* Bytes of space for iSerial as varint */
  u32 nVal;                       /* Bytes of space required for argv[0] */
  int nRet;
  sqlite3 *db;
  u8 *aRet;

  UNUSED_PARAMETER( argc );
  iSerial = sqlite3VdbeSerialType(argv[0], file_format, &nVal);
  nSerial = sqlite3VarintLen(iSerial);
  db = sqlite3_context_db_handle(context);

  nRet = 1 + nSerial + nVal;
  aRet = sqlite3DbMallocRawNN(db, nRet);
  if( aRet==0 ){
    sqlite3_result_error_nomem(context);
  }else{
    aRet[0] = nSerial+1;
    putVarint32(&aRet[1], iSerial);
    sqlite3VdbeSerialPut(&aRet[1+nSerial], argv[0], iSerial);
    sqlite3_result_blob(context, aRet, nRet, SQLITE_TRANSIENT);
    sqlite3DbFreeNN(db, aRet);
  }
}